

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stcp.c
# Opt level: O0

void nn_stcp_term(nn_stcp *self)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x58) != 1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)(in_RDI + 0x58),
            "NN_STCP_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
            ,0x58);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_fsm_event_term((nn_fsm_event *)(in_RDI + 0x3c8));
  nn_msg_term((nn_msg *)0x16e6ab);
  nn_msg_term((nn_msg *)0x16e6bb);
  nn_pipebase_term((nn_pipebase *)0x16e6cb);
  nn_streamhdr_term((nn_streamhdr *)0x16e6d8);
  nn_fsm_term((nn_fsm *)0x16e6e1);
  return;
}

Assistant:

void nn_stcp_term (struct nn_stcp *self)
{
    nn_assert_state (self, NN_STCP_STATE_IDLE);

    nn_fsm_event_term (&self->done);
    nn_msg_term (&self->outmsg);
    nn_msg_term (&self->inmsg);
    nn_pipebase_term (&self->pipebase);
    nn_streamhdr_term (&self->streamhdr);
    nn_fsm_term (&self->fsm);
}